

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.h
# Opt level: O2

string * __thiscall cmMakefile::GetIncludeRegularExpression_abi_cxx11_(cmMakefile *this)

{
  string *psVar1;
  allocator<char> local_31;
  string local_30;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_30,"INCLUDE_REGULAR_EXPRESSION",&local_31);
  psVar1 = (string *)GetProperty(this,&local_30);
  if (psVar1 == (string *)0x0) {
    psVar1 = &cmValue::Empty_abi_cxx11_;
  }
  std::__cxx11::string::~string((string *)&local_30);
  return psVar1;
}

Assistant:

const std::string& GetIncludeRegularExpression() const
  {
    return this->GetProperty("INCLUDE_REGULAR_EXPRESSION");
  }